

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvar.c
# Opt level: O0

LispPTR N_OP_fvar_(LispPTR tos,int n)

{
  DLword *achain;
  uint *puVar1;
  DLword *pfreeval;
  DLword *ppvar;
  int n_local;
  LispPTR tos_local;
  
  achain = MachineState.pvar + n;
  if ((*(ushort *)((ulong)achain ^ 2) & 1) != 0) {
    nfvlookup((frameex1 *)(MachineState.pvar + -10),achain,MachineState.currentfunc);
  }
  puVar1 = (uint *)NativeAligned2FromLAddr
                             ((*(ushort *)((ulong)(achain + 1) ^ 2) & 0xfff) << 0x10 |
                              (uint)*(ushort *)((ulong)achain ^ 2));
  if ((*(ushort *)((ulong)(achain + 1) ^ 2) & 0xff) != 1) {
    if (((*(ushort *)((ulong)(MDStypetbl + (*puVar1 >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(*puVar1,1);
      }
      else {
        htfind(*puVar1,1);
      }
    }
    if (((*(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(tos,0);
      }
      else {
        htfind(tos,0);
      }
    }
  }
  *puVar1 = tos;
  return tos;
}

Assistant:

LispPTR N_OP_fvar_(LispPTR tos, int n) {
  DLword *ppvar;    /* pointer to argued Fvar slot in pvar area */
  DLword *pfreeval; /* pointer to argued free value */

  ppvar = PVar + n;

  if (WBITSPTR(ppvar)->LSB) /* check unbound ? */
  {                         /* unbound */
    nfvlookup(CURRENTFX, ppvar, FuncObj);
  }

  pfreeval = NativeAligned2FromLAddr(MaskShift((GETWORD(ppvar + 1))) | GETWORD(ppvar));

  if (((0xFF & GETWORD(ppvar + 1)) != STK_HI)) {
    GCLOOKUP(*((LispPTR *)pfreeval), DELREF);
    GCLOOKUP(tos, ADDREF);
  }

  *((LispPTR *)pfreeval) = tos;
  return (tos);
}